

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLaplacian::getSolvabilityOffset(MLNodeLaplacian *this,int amrlev,int mglev,Any *a_rhs)

{
  uint uVar1;
  initializer_list<std::reference_wrapper<double>_> iVar2;
  initializer_list<double> iVar3;
  initializer_list<std::reference_wrapper<double>_> iVar4;
  initializer_list<double> iVar5;
  bool bVar6;
  pointer pFVar7;
  Geometry *pGVar8;
  Box *pBVar9;
  const_reference pvVar10;
  int *piVar11;
  type_conflict1 *ptVar12;
  int in_ECX;
  long in_RSI;
  Vector<double,_std::allocator<double>_> *in_RDI;
  Type TVar13;
  Real s2_1;
  Real s1_1;
  Type r_1;
  MultiArray4<const_double> *rhs_ma_1;
  MultiArray4<const_double> *mask_ma_1;
  MultiFab *mask_1;
  int idim_1;
  Box nddom;
  Real s2;
  Real s1;
  Type r;
  MultiArray4<const_double> *rhs_ma;
  MultiArray4<const_double> *mask_ma;
  MultiFab *mask;
  int idim;
  Box dom;
  MultiArray4<const_double> *vfrac_ma;
  MultiFab *vfrac;
  EBFArrayBoxFactory *factory;
  MultiFab *rhs;
  int i;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffc78;
  MPI_Comm comm;
  allocator_type *paVar14;
  MLLinOp *in_stack_fffffffffffffc80;
  MultiFab *pMVar15;
  iterator in_stack_fffffffffffffc88;
  IntVect *this_00;
  size_type in_stack_fffffffffffffc90;
  gpu_tuple_element<1UL,_double> *pgVar16;
  long local_358;
  Any *in_stack_fffffffffffffcb8;
  long local_310;
  long local_300;
  allocator_type local_2d1;
  double local_2d0;
  double *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  undefined8 local_298;
  type_conflict1 local_278;
  type_conflict1 local_270;
  int local_268;
  int iStack_264;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  IntVect local_230;
  gpu_tuple_element<1UL,_double> local_220;
  double local_218;
  Array4<const_double> *local_210;
  Array4<const_double> **local_208;
  Array4<const_double> *local_200;
  Array4<const_double> **local_1f8;
  long local_1f0;
  int local_1e4;
  Box local_1e0;
  double local_1c0;
  double *local_1b8;
  undefined8 local_1b0;
  undefined1 local_190 [16];
  undefined1 *local_180;
  undefined8 local_178;
  type_conflict1 local_158;
  type_conflict1 local_150;
  int local_148;
  int iStack_144;
  int iStack_140;
  int local_13c;
  int iStack_138;
  int iStack_134;
  uint uStack_130;
  Array4<const_double> *local_128;
  Array4<const_double> *local_120;
  Array4<const_double> *local_118;
  IntVect local_110;
  gpu_tuple_element<1UL,_double> local_100;
  double local_f8;
  Array4<const_double> *local_f0;
  Array4<const_double> **local_e8;
  Array4<const_double> *local_e0;
  Array4<const_double> **local_d8;
  long local_d0;
  int local_c8;
  Box local_c4;
  Array4<const_double> *local_a8;
  Array4<const_double> **local_a0;
  MultiFab *local_98;
  long local_90;
  MultiFab *local_88;
  int local_78;
  undefined1 local_74 [20];
  Box *local_60;
  undefined1 *local_58;
  int local_4c;
  Box *local_48;
  int local_3c;
  IndexType *local_38;
  undefined4 local_30;
  int local_2c;
  IntVect *local_28;
  IndexType *local_20;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_58 = local_74;
  if (*(int *)(in_RSI + 0x560) == 1) {
    local_78 = in_ECX;
    local_88 = Any::get<amrex::MultiFab>(in_stack_fffffffffffffcb8);
    Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                  *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                  *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
    pFVar7 = std::
             unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ::get((unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                    *)in_stack_fffffffffffffc80);
    if (pFVar7 == (pointer)0x0) {
      local_300 = 0;
    }
    else {
      local_300 = __dynamic_cast(pFVar7,&FabFactory<amrex::FArrayBox>::typeinfo,
                                 &EBFArrayBoxFactory::typeinfo,0);
    }
    local_90 = local_300;
    if (((local_78 == 0) && (local_300 != 0)) &&
       (bVar6 = EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x1571e9f), !bVar6)) {
      local_98 = EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_fffffffffffffc80);
      local_a8 = (Array4<const_double> *)
                 FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                           (in_stack_fffffffffffffc78);
      local_a0 = &local_a8;
      pGVar8 = MLLinOp::Geom(in_stack_fffffffffffffc80,
                             (int)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                             (int)in_stack_fffffffffffffc78);
      pBVar9 = Geometry::Domain(pGVar8);
      local_c4.smallend.vect._0_8_ = *(undefined8 *)(pBVar9->smallend).vect;
      local_c4._8_8_ = *(undefined8 *)((pBVar9->smallend).vect + 2);
      local_c4.bigend.vect._4_8_ = *(undefined8 *)((pBVar9->bigend).vect + 1);
      local_c4.btype.itype = (pBVar9->btype).itype;
      for (local_c8 = 0; local_c8 < 3; local_c8 = local_c8 + 1) {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                            ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                             (size_type)in_stack_fffffffffffffc78);
        if (*pvVar10 != Neumann) {
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                              ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                               (size_type)in_stack_fffffffffffffc78);
          if (*pvVar10 != inflow) {
            Box::growLo(&local_c4,local_c8,10);
          }
        }
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                            ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                             (size_type)in_stack_fffffffffffffc78);
        if (*pvVar10 != Neumann) {
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
          pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                              ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                               (size_type)in_stack_fffffffffffffc78);
          if (*pvVar10 != inflow) {
            Box::growHi(&local_c4,local_c8,10);
          }
        }
      }
      piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                          ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                           (size_type)in_stack_fffffffffffffc78);
      if (local_78 + 1 == *piVar11) {
        local_310 = in_RSI + 0x248;
      }
      else {
        local_310 = in_RSI + 0x3c8;
      }
      local_d0 = local_310;
      local_e0 = (Array4<const_double> *)
                 FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                           (in_stack_fffffffffffffc78);
      local_d8 = &local_e0;
      local_f0 = (Array4<const_double> *)
                 FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                           (in_stack_fffffffffffffc78);
      pMVar15 = local_88;
      local_e8 = &local_f0;
      IntVect::IntVect(&local_110,0);
      iStack_138 = local_c4.bigend.vect[1];
      iStack_134 = local_c4.bigend.vect[2];
      uStack_130 = local_c4.btype.itype;
      local_148 = local_c4.smallend.vect[0];
      iStack_144 = local_c4.smallend.vect[1];
      iStack_140 = local_c4.smallend.vect[2];
      local_13c = local_c4.bigend.vect[0];
      local_128 = *local_a0;
      local_120 = *local_d8;
      local_118 = *local_e8;
      TVar13 = ParReduce<amrex::ReduceOpSum,amrex::ReduceOpSum,double,double,amrex::FArrayBox,amrex::MLNodeLaplacian::getSolvabilityOffset(int,int,amrex::Any_const&)const::__0,void>
                         (pMVar15,&local_110,&local_148);
      local_100.m_value =
           (double)TVar13.super_gpu_tuple_impl<0UL,_double,_double>.
                   super_gpu_tuple_impl<1UL,_double>.super_gpu_tuple_element<1UL,_double>.m_value;
      local_f8 = (double)TVar13.super_gpu_tuple_impl<0UL,_double,_double>.
                         super_gpu_tuple_element<0UL,_double>.m_value;
      ptVar12 = get<0ul,double,double>((GpuTuple<double,_double> *)0x15721b0);
      local_150 = *ptVar12;
      ptVar12 = get<1ul,double,double>((GpuTuple<double,_double> *)0x15721c7);
      local_158 = *ptVar12;
      std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
                ((reference_wrapper<double> *)in_stack_fffffffffffffc80,
                 (double *)in_stack_fffffffffffffc78);
      std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
                ((reference_wrapper<double> *)in_stack_fffffffffffffc80,
                 (double *)in_stack_fffffffffffffc78);
      local_178 = 2;
      local_180 = local_190;
      std::allocator<std::reference_wrapper<double>_>::allocator
                ((allocator<std::reference_wrapper<double>_> *)0x157222e);
      iVar2._M_len = in_stack_fffffffffffffc90;
      iVar2._M_array = in_stack_fffffffffffffc88;
      Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
      vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
              *)in_stack_fffffffffffffc80,iVar2,(allocator_type *)in_stack_fffffffffffffc78);
      ParallelContext::CommunicatorSub();
      ParallelAllReduce::Sum<double>
                ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                  *)in_stack_fffffffffffffc80,(MPI_Comm)((ulong)in_stack_fffffffffffffc78 >> 0x20));
      Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
      ~Vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
               *)0x1572275);
      std::allocator<std::reference_wrapper<double>_>::~allocator
                ((allocator<std::reference_wrapper<double>_> *)0x1572282);
      local_1c0 = local_150 / local_158;
      local_1b8 = &local_1c0;
      local_1b0 = 1;
      std::allocator<double>::allocator((allocator<double> *)0x15722cf);
      iVar3._M_len = in_stack_fffffffffffffc90;
      iVar3._M_array = (iterator)in_stack_fffffffffffffc88;
      Vector<double,_std::allocator<double>_>::vector
                ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc80,iVar3,
                 (allocator_type *)in_stack_fffffffffffffc78);
      std::allocator<double>::~allocator((allocator<double> *)0x1572300);
      return in_RDI;
    }
    pGVar8 = MLLinOp::Geom(in_stack_fffffffffffffc80,(int)((ulong)in_stack_fffffffffffffc78 >> 0x20)
                           ,(int)in_stack_fffffffffffffc78);
    local_60 = Geometry::Domain(pGVar8);
    local_1e0.smallend.vect._0_8_ = *(undefined8 *)(local_60->smallend).vect;
    local_1e0._8_8_ = *(undefined8 *)((local_60->smallend).vect + 2);
    local_1e0.bigend.vect._4_8_ = *(undefined8 *)((local_60->bigend).vect + 1);
    uVar1 = (local_60->btype).itype;
    local_48 = &local_1e0;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      local_38 = &local_1e0.btype;
      local_3c = local_4c;
      local_14 = local_4c;
      local_4 = local_4c;
      if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) == 0) {
        local_28 = &local_1e0.bigend;
        local_2c = local_4c;
        local_30 = 1;
        local_28->vect[local_4c] = local_28->vect[local_4c] + 1;
      }
      local_10 = local_38;
    }
    local_20 = &local_1e0.btype;
    local_1e0.btype.itype = 7;
    for (local_1e4 = 0; local_1e4 < 3; local_1e4 = local_1e4 + 1) {
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
      pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                          ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                           (size_type)in_stack_fffffffffffffc78);
      if (*pvVar10 != Neumann) {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                            ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                             (size_type)in_stack_fffffffffffffc78);
        if (*pvVar10 != inflow) {
          Box::growLo(&local_1e0,local_1e4,10);
        }
      }
      Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
      pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                          ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                           (size_type)in_stack_fffffffffffffc78);
      if (*pvVar10 != Neumann) {
        Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                      *)in_stack_fffffffffffffc80,(size_type)in_stack_fffffffffffffc78);
        pvVar10 = std::array<amrex::LinOpBCType,_3UL>::operator[]
                            ((array<amrex::LinOpBCType,_3UL> *)in_stack_fffffffffffffc80,
                             (size_type)in_stack_fffffffffffffc78);
        if (*pvVar10 != inflow) {
          Box::growHi(&local_1e0,local_1e4,10);
        }
      }
    }
    piVar11 = Vector<int,_std::allocator<int>_>::operator[]
                        ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                         (size_type)in_stack_fffffffffffffc78);
    if (local_78 + 1 == *piVar11) {
      local_358 = in_RSI + 0x248;
    }
    else {
      local_358 = in_RSI + 0x3c8;
    }
    local_1f0 = local_358;
    local_200 = (Array4<const_double> *)
                FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                          (in_stack_fffffffffffffc78);
    local_1f8 = &local_200;
    local_210 = (Array4<const_double> *)
                FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                          (in_stack_fffffffffffffc78);
    local_208 = &local_210;
    this_00 = &local_230;
    pMVar15 = local_88;
    IntVect::IntVect(this_00,0);
    local_268 = local_1e0.smallend.vect[0];
    iStack_264 = local_1e0.smallend.vect[1];
    TVar13 = ParReduce<amrex::ReduceOpSum,amrex::ReduceOpSum,double,double,amrex::FArrayBox,amrex::MLNodeLaplacian::getSolvabilityOffset(int,int,amrex::Any_const&)const::__1,void>
                       (pMVar15,this_00,&local_268);
    local_220.m_value =
         (double)TVar13.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_impl<1UL,_double>.
                 super_gpu_tuple_element<1UL,_double>.m_value;
    local_218 = (double)TVar13.super_gpu_tuple_impl<0UL,_double,_double>.
                        super_gpu_tuple_element<0UL,_double>.m_value;
    pgVar16 = &local_220;
    ptVar12 = get<0ul,double,double>((GpuTuple<double,_double> *)0x1572763);
    local_270 = *ptVar12;
    ptVar12 = get<1ul,double,double>((GpuTuple<double,_double> *)0x157277a);
    local_278 = *ptVar12;
    std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
              ((reference_wrapper<double> *)pMVar15,(double *)in_stack_fffffffffffffc78);
    std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
              ((reference_wrapper<double> *)pMVar15,(double *)in_stack_fffffffffffffc78);
    local_298 = 2;
    local_2a0 = local_2b0;
    std::allocator<std::reference_wrapper<double>_>::allocator
              ((allocator<std::reference_wrapper<double>_> *)0x15727e1);
    iVar4._M_len = (size_type)pgVar16;
    iVar4._M_array = (iterator)this_00;
    Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::vector
              ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)pMVar15,iVar4,(allocator_type *)in_stack_fffffffffffffc78);
    comm = (MPI_Comm)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    ParallelContext::CommunicatorSub();
    ParallelAllReduce::Sum<double>
              ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)pMVar15,comm);
    Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::
    ~Vector((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
             *)0x1572828);
    std::allocator<std::reference_wrapper<double>_>::~allocator
              ((allocator<std::reference_wrapper<double>_> *)0x1572835);
    local_2d0 = local_270 / local_278;
    local_2c8 = &local_2d0;
    local_2c0 = 1;
    paVar14 = &local_2d1;
    std::allocator<double>::allocator((allocator<double> *)0x1572881);
    iVar5._M_len = (size_type)pgVar16;
    iVar5._M_array = (iterator)this_00;
    Vector<double,_std::allocator<double>_>::vector
              ((Vector<double,_std::allocator<double>_> *)pMVar15,iVar5,paVar14);
    std::allocator<double>::~allocator((allocator<double> *)0x15728b1);
  }
  else {
    MLNodeLinOp::getSolvabilityOffset
              ((MLNodeLinOp *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffdac,in_stack_fffffffffffffda8,
               (Any *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  }
  return in_RDI;
}

Assistant:

Vector<Real>
MLNodeLaplacian::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto const& rhs = a_rhs.get<MultiFab>();

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        if (mglev == 0 && factory && !factory->isAllRegular()) {
            const MultiFab& vfrac = factory->getVolFrac();
            const auto& vfrac_ma = vfrac.const_arrays();

            Box dom = Geom(amrlev,mglev).Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growLo(idim, 10);
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                               -> GpuTuple<Real,Real>
                               {
                                   Real scale = 0.0_rt;
#if (AMREX_SPACEDIM == 3)
                                   int const koff = 1;
                                   Real const fac = 0.125_rt;
#else
                                   int const koff = 0;
                                   Real const fac = 0.25_rt;
#endif
                                   for (int kc = k-koff; kc <= k; ++kc) {
                                   for (int jc = j-1   ; jc <= j; ++jc) {
                                   for (int ic = i-1   ; ic <= i; ++ic) {
                                       if (dom.contains(ic,jc,kc)) {
                                           scale += vfrac_ma[box_no](ic,jc,kc) * fac;
                                       }
                                   }}}
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        } else
#endif
        {
            Box nddom = amrex::surroundingNodes(Geom(amrlev,mglev).Domain());
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growLo(idim, 10); // so that the test in ParReduce will faill
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                                   -> GpuTuple<Real,Real>
                               {
                                   Real scale = 1.0_rt;
                                   if (i == nddom.smallEnd(0) ||
                                       i == nddom.bigEnd(0)) {
                                       scale *= 0.5_rt;
                                   }
#if (AMREX_SPACEDIM >= 2)
                                   if (j == nddom.smallEnd(1) ||
                                       j == nddom.bigEnd(1)) {
                                       scale *= 0.5_rt;
                                   }
#endif
#if (AMREX_SPACEDIM == 3)
                                   if (k == nddom.smallEnd(2) ||
                                       k == nddom.bigEnd(2)) {
                                       scale *= 0.5_rt;
                                   }
#endif
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        }
    } else {
        return MLNodeLinOp::getSolvabilityOffset(amrlev, mglev, a_rhs);
    }
}